

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O0

void helics::CoreFactory::terminateAllCores(void)

{
  bool bVar1;
  element_type *peVar2;
  shared_ptr<helics::Core> *core;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_> *__range2;
  vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_> cores;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  milliseconds in_stack_ffffffffffffffb0;
  vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
  *in_stack_ffffffffffffffc0;
  __normal_iterator<std::shared_ptr<helics::Core>_*,_std::vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>_>
  local_28;
  undefined1 *local_20;
  undefined1 local_18 [16];
  SearchableObjectHolder<helics::Core,_helics::CoreType> *in_stack_fffffffffffffff8;
  
  gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::getObjects
            (in_stack_fffffffffffffff8);
  local_20 = local_18;
  local_28._M_current =
       (shared_ptr<helics::Core> *)
       std::vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>::
       begin((vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
              *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  std::vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>::end
            ((vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
              *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::shared_ptr<helics::Core>_*,_std::vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>_>
                      ((__normal_iterator<std::shared_ptr<helics::Core>_*,_std::vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>_>
                        *)in_stack_ffffffffffffffb0.__r,
                       (__normal_iterator<std::shared_ptr<helics::Core>_*,_std::vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<helics::Core>_*,_std::vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>_>
    ::operator*(&local_28);
    peVar2 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x51397d);
    (*peVar2->_vptr_Core[8])();
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<helics::Core>_*,_std::vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>_>
    ::operator++(&local_28);
  }
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&stack0xffffffffffffffb0,
             (int *)&stack0xffffffffffffffac);
  cleanUpCores(in_stack_ffffffffffffffb0);
  std::vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>::
  ~vector(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void terminateAllCores()
{
    auto cores = searchableCores.getObjects();
    for (auto& core : cores) {
        core->disconnect();
    }
    cleanUpCores(std::chrono::milliseconds(250));
}